

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
* __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::exception_message(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *this,token_type expected)

{
  char *pcVar1;
  token_type in_EDX;
  undefined4 in_register_00000034;
  long lVar2;
  allocator local_161;
  string local_160 [32];
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  string local_f8 [32];
  undefined1 local_d8 [40];
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [50];
  allocator local_1e;
  undefined1 local_1d;
  token_type local_1c;
  long lStack_18;
  token_type expected_local;
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  string *error_msg;
  
  lVar2 = CONCAT44(in_register_00000034,expected);
  local_1d = 0;
  local_1c = in_EDX;
  lStack_18 = lVar2;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"syntax error - ",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  if (*(int *)(lVar2 + 0x20) == 0xe) {
    pcVar1 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::get_error_message((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)(lVar2 + 0x28));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,(allocator *)(local_d8 + 0x27));
    std::operator+(local_90,(char *)local_b0);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_d8);
    std::operator+(local_70,local_90);
    std::operator+(local_50,(char *)local_70);
    std::__cxx11::string::operator+=((string *)this,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0x27));
  }
  else {
    pcVar1 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::token_type_name(*(token_type *)(lVar2 + 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,pcVar1,&local_119);
    std::operator+((char *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "unexpected ");
    std::__cxx11::string::operator+=((string *)this,local_f8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  if (local_1c != uninitialized) {
    pcVar1 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::token_type_name(local_1c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,pcVar1,&local_161);
    std::operator+((char *)local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "; expected ");
    std::__cxx11::string::operator+=((string *)this,local_140);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  return this;
}

Assistant:

std::string exception_message(const token_type expected)
    {
        std::string error_msg = "syntax error - ";
        if (last_token == token_type::parse_error)
        {
            error_msg += std::string(m_lexer.get_error_message()) + "; last read: '" +
                         m_lexer.get_token_string() + "'";
        }
        else
        {
            error_msg += "unexpected " + std::string(lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += "; expected " + std::string(lexer_t::token_type_name(expected));
        }

        return error_msg;
    }